

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall
LiteScript::CreateVariable
          (LiteScript *this,Memory *memory,
          _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
          *value)

{
  Object *this_00;
  Callback *this_01;
  uint *extraout_RDX;
  Variable VVar1;
  Callback local_d8;
  undefined1 local_21;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *local_20;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *value_local;
  Memory *memory_local;
  Variable *v;
  
  local_21 = 0;
  local_20 = value;
  value_local = (_func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
                 *)memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  Callback::Callback(&local_d8,(Memory *)value_local,local_20);
  this_00 = Variable::operator->((Variable *)this);
  this_01 = Object::GetData<LiteScript::Callback>(this_00);
  Callback::operator=(this_01,&local_d8);
  Callback::~Callback(&local_d8);
  VVar1.nb_ref = extraout_RDX;
  VVar1.obj = (Object *)this;
  return VVar1;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, Variable (* value)(State &, std::vector<Variable> &)) {
    Variable v = memory.Create(Type::CALLBACK);
    v->GetData<Callback>() = Callback(memory, value);
    return v;
}